

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_create_function(jx9_vm *pVm,char *zName,
                       _func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *xFunc,void *pUserData)

{
  char cVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  SyString local_50;
  void *local_40;
  _func_int_jx9_context_ptr_int_jx9_value_ptr_ptr *local_38;
  
  sVar3 = -0x18;
  if ((pVm != (jx9_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pcVar4 = zName;
    if (*zName != '\0') {
      pcVar2 = zName + 2;
      do {
        pcVar4 = pcVar2;
        if (pcVar4[-1] == '\0') {
          pcVar4 = pcVar4 + -1;
          goto LAB_0011916d;
        }
        if (*pcVar4 == '\0') goto LAB_0011916d;
        if (pcVar4[1] == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0011916d;
        }
        pcVar2 = pcVar4 + 4;
      } while (pcVar4[2] != '\0');
      pcVar4 = pcVar4 + 2;
    }
LAB_0011916d:
    uVar6 = (int)pcVar4 - (int)zName;
    local_50.zString = zName;
    local_50.nByte = uVar6;
    local_40 = pUserData;
    local_38 = xFunc;
    if (uVar6 != 0) {
      do {
        cVar1 = *zName;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) goto LAB_001191ac;
        zName = zName + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar6 = 0;
    }
LAB_001191ac:
    bVar8 = uVar6 == 0;
    local_50.zString = zName;
    if ((!bVar8) && (bVar7 = zName[uVar6 - 1], bVar7 < 0xc0)) {
      local_50.nByte = uVar6;
      ppuVar5 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar7 * 2 + 1) & 0x20) == 0) break;
        bVar8 = uVar6 == 1;
        if (bVar8) {
          uVar6 = 0;
          break;
        }
        bVar7 = zName[uVar6 - 2];
        uVar6 = uVar6 - 1;
      } while (bVar7 < 0xc0);
    }
    if ((local_38 != (ProcHostFunction)0x0) && (!bVar8)) {
      local_50.nByte = uVar6;
      sVar3 = jx9VmInstallForeignFunction(pVm,&local_50,local_38,local_40);
    }
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE int jx9_create_function(jx9_vm *pVm, const char *zName, int (*xFunc)(jx9_context *, int, jx9_value **), void *pUserData)
{
	SyString sName;
	int rc;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return JX9_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	/* Ticket 1433-003: NULL values are not allowed */
	if( sName.nByte < 1 || xFunc == 0 ){
		return JX9_CORRUPT;
	}
#if defined(JX9_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
	 if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE && 
		 JX9_THRD_VM_RELEASE(pVm) ){
			 return JX9_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Install the foreign function */
	rc = jx9VmInstallForeignFunction(&(*pVm), &sName, xFunc, pUserData); 
#if defined(JX9_ENABLE_THREADS)
	 /* Leave VM mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
#endif
	return rc;
}